

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

_Bool av1_check_ref_is_low_spatial_res_super_frame(AV1_COMP *cpi,int ref_frame)

{
  int iVar1;
  AV1_PRIMARY *pAVar2;
  
  pAVar2 = cpi->ppi;
  iVar1 = (pAVar2->rtc_ref).reference[(long)ref_frame + 6];
  if ((pAVar2->rtc_ref).buffer_time_index[iVar1] == (cpi->svc).current_superframe) {
    return (int)(uint)(pAVar2->rtc_ref).buffer_spatial_layer[iVar1] < (cpi->svc).spatial_layer_id;
  }
  return false;
}

Assistant:

bool av1_check_ref_is_low_spatial_res_super_frame(AV1_COMP *const cpi,
                                                  int ref_frame) {
  SVC *svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  int ref_frame_idx = rtc_ref->ref_idx[ref_frame - 1];
  return rtc_ref->buffer_time_index[ref_frame_idx] == svc->current_superframe &&
         rtc_ref->buffer_spatial_layer[ref_frame_idx] <=
             svc->spatial_layer_id - 1;
}